

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 iwmmxt_load_creg(TCGContext_conflict1 *tcg_ctx,int reg)

{
  TCGv_i32 ret;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(uint)reg * 4 + 0x2fa0);
  return ret;
}

Assistant:

static inline TCGv_i32 iwmmxt_load_creg(TCGContext *tcg_ctx, int reg)
{
    TCGv_i32 var = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, var, tcg_ctx->cpu_env, offsetof(CPUARMState, iwmmxt.cregs[reg]));
    return var;
}